

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

long lsh::vector::random(void)

{
  uint uVar1;
  result_type rVar2;
  size_t __i;
  long lVar3;
  uint in_ESI;
  uint uVar4;
  vector *in_RDI;
  ulong uVar5;
  uniform_int_distribution<int> components;
  mt19937 generator;
  random_device random;
  allocator_type local_276a;
  bool local_2769;
  param_type local_2768;
  vector<bool,_std::allocator<bool>_> local_2760;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2738;
  random_device local_13b0;
  
  std::random_device::random_device(&local_13b0);
  uVar1 = std::random_device::_M_getval();
  local_2738._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar5 = local_2738._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar3);
    local_2738._M_x[lVar3] = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_2738._M_p = 0x270;
  local_2768._M_a = 0;
  local_2768._M_b = 1;
  local_2769 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_2760,(ulong)in_ESI,&local_2769,&local_276a);
  if (in_ESI != 0) {
    uVar1 = 0;
    do {
      rVar2 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_2768,&local_2738,&local_2768);
      uVar4 = uVar1 >> 6;
      uVar5 = 1L << ((byte)uVar1 & 0x3f);
      if (rVar2 == 0) {
        uVar5 = ~uVar5 & local_2760.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4];
      }
      else {
        uVar5 = uVar5 | local_2760.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4];
      }
      local_2760.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p[uVar4] = uVar5;
      uVar1 = uVar1 + 1;
    } while (in_ESI != uVar1);
  }
  vector(in_RDI,&local_2760);
  if (local_2760.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2760.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  std::random_device::_M_fini();
  return (long)in_RDI;
}

Assistant:

vector vector::random(unsigned int d) {
    std::random_device random;
    std::mt19937 generator(random());
    std::uniform_int_distribution<> components(0, 1);

    std::vector<bool> c(d);

    for (unsigned int i = 0; i < d; i++) {
      c[i] = components(generator);
    }

    return vector(c);
  }